

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall
ON_SimpleArray<ON_SubDEdgePtr>::Append
          (ON_SimpleArray<ON_SubDEdgePtr> *this,int count,ON_SubDEdgePtr *buffer)

{
  size_t sz;
  int local_34;
  void *pvStack_30;
  int newcapacity;
  void *temp;
  size_t sizeof_buffer;
  ON_SubDEdgePtr *buffer_local;
  int count_local;
  ON_SimpleArray<ON_SubDEdgePtr> *this_local;
  
  if ((0 < count) && (buffer != (ON_SubDEdgePtr *)0x0)) {
    sz = (long)count << 3;
    pvStack_30 = (void *)0x0;
    sizeof_buffer = (size_t)buffer;
    if (this->m_capacity < count + this->m_count) {
      local_34 = NewCapacity(this);
      if (local_34 < count + this->m_count) {
        local_34 = count + this->m_count;
      }
      if ((this->m_a <= buffer) && (buffer < this->m_a + this->m_capacity)) {
        pvStack_30 = onmalloc(sz);
        memcpy(pvStack_30,buffer,sz);
        sizeof_buffer = (size_t)pvStack_30;
      }
      Reserve(this,(long)local_34);
    }
    memcpy(this->m_a + this->m_count,(void *)sizeof_buffer,sz);
    if (pvStack_30 != (void *)0x0) {
      onfree(pvStack_30);
    }
    this->m_count = count + this->m_count;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( int count, const T* buffer ) 
{
  if ( count > 0 && nullptr != buffer ) 
  {
    const size_t sizeof_buffer = count * sizeof(T);
    void* temp = nullptr;
    if ( count + m_count > m_capacity ) 
    {
      int newcapacity = NewCapacity();
      if ( newcapacity < count + m_count )
        newcapacity = count + m_count;
      if ( buffer >= m_a && buffer < (m_a + m_capacity) )
      {
        // buffer is in the block of memory about to be reallocated
        temp = onmalloc(sizeof_buffer);
        memcpy(temp, buffer, sizeof_buffer);
        buffer = (const T*)temp;
      }
      Reserve( newcapacity );
    }
    memcpy( (void*)(m_a + m_count), (void*)(buffer), sizeof_buffer );
    if (nullptr != temp)
      onfree(temp);
    m_count += count;
  }
}